

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O3

int __thiscall NetOptimize::fwrite_weight_data(NetOptimize *this,Mat *data,FILE *bp)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uchar padding [4];
  undefined4 local_64;
  Mat local_60;
  
  lVar2 = ftell((FILE *)bp);
  ncnn::Mat::reshape(&local_60,data,data->h * data->w * data->c,(Allocator *)0x0);
  fwrite(local_60.data,local_60.elemsize,(long)local_60.w,(FILE *)bp);
  lVar3 = ftell((FILE *)bp);
  iVar1 = (int)lVar3 - (int)lVar2;
  local_64 = 0;
  fwrite(&local_64,1,(long)(int)((iVar1 + 3U & 0xfffffffc) - iVar1),(FILE *)bp);
  if (local_60.refcount != (int *)0x0) {
    LOCK();
    *local_60.refcount = *local_60.refcount + -1;
    UNLOCK();
    if (*local_60.refcount == 0) {
      if (local_60.allocator == (Allocator *)0x0) {
        if (local_60.data != (void *)0x0) {
          free(local_60.data);
        }
      }
      else {
        (**(code **)(*(long *)local_60.allocator + 0x18))();
      }
    }
  }
  return 0;
}

Assistant:

int NetOptimize::fwrite_weight_data(const ncnn::Mat& data, FILE* bp)
{
    int p0 = ftell(bp);

    ncnn::Mat data_flattened = data.reshape(data.w * data.h * data.c);
    fwrite(data_flattened.data, data_flattened.elemsize, data_flattened.w, bp);

    // padding to 32bit align
    int nwrite = ftell(bp) - p0;
    int nalign = alignSize(nwrite, 4);
    unsigned char padding[4] = {0x00, 0x00, 0x00, 0x00};
    fwrite(padding, sizeof(unsigned char), nalign - nwrite, bp);

    return 0;
}